

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonToken.cpp
# Opt level: O1

RefToken CommonToken::factory(void)

{
  Token *this;
  Token *pTVar1;
  Ref *in_RDI;
  
  this = (Token *)operator_new(0x30);
  Token::Token(this);
  this->_vptr_Token = (_func_int **)&PTR_getColumn_00243940;
  this[1]._vptr_Token = (_func_int **)(this + 2);
  *(undefined8 *)&this[1].type = 0;
  *(undefined1 *)&this[2]._vptr_Token = 0;
  pTVar1 = (Token *)operator_new(0x10);
  pTVar1->_vptr_Token = (_func_int **)this;
  pTVar1->type = 1;
  in_RDI->ptr = pTVar1;
  return (RefToken)in_RDI;
}

Assistant:

RefToken CommonToken::factory()
{
	return RefToken(new CommonToken);
}